

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O1

bool __thiscall S2Polyline::MayIntersect(S2Polyline *this,S2Cell *cell)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  S2Point *pSVar4;
  int iVar5;
  ulong uVar6;
  int i;
  long lVar7;
  bool bVar8;
  S2EdgeCrosser crosser;
  S2Point cell_vertices [4];
  S2EdgeCrosser local_108;
  S2Point local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->num_vertices_ == 0) {
    bVar8 = false;
  }
  else {
    bVar8 = 0 < this->num_vertices_;
    if (0 < this->num_vertices_) {
      pSVar4 = vertex(this,0);
      bVar2 = S2Cell::Contains(cell,pSVar4);
      if (!bVar2) {
        iVar5 = 1;
        do {
          bVar8 = iVar5 < this->num_vertices_;
          if (this->num_vertices_ <= iVar5) goto LAB_00213530;
          pSVar4 = vertex(this,iVar5);
          bVar2 = S2Cell::Contains(cell,pSVar4);
          iVar5 = iVar5 + 1;
        } while (!bVar2);
      }
      if (bVar8) {
        return true;
      }
    }
LAB_00213530:
    pSVar4 = &local_98;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_98.c_[2] = 0.0;
    uStack_80 = 0;
    local_98.c_[0] = 0.0;
    local_98.c_[1] = 0.0;
    lVar7 = 0;
    do {
      S2Cell::GetVertex((S2Point *)&local_108,cell,(int)lVar7);
      pSVar4->c_[2] = local_108.a_cross_b_.c_[0];
      pSVar4->c_[0] = (VType)local_108.a_;
      pSVar4->c_[1] = (VType)local_108.b_;
      lVar7 = lVar7 + 1;
      pSVar4 = pSVar4 + 1;
    } while (lVar7 != 4);
    bVar8 = true;
    uVar6 = 0;
    do {
      uVar1 = uVar6 + 1;
      pSVar4 = vertex(this,0);
      S2EdgeCrosser::S2EdgeCrosser
                (&local_108,&local_98 + uVar6,&local_98 + ((uint)uVar1 & 3),pSVar4);
      if (1 < this->num_vertices_) {
        iVar5 = 1;
        do {
          pSVar4 = vertex(this,iVar5);
          iVar3 = S2EdgeCrosser::CrossingSign(&local_108,pSVar4);
          if (-1 < iVar3) {
            return bVar8;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < this->num_vertices_);
      }
      bVar8 = uVar6 < 3;
      uVar6 = uVar1;
    } while (uVar1 != 4);
  }
  return bVar8;
}

Assistant:

bool S2Polyline::MayIntersect(const S2Cell& cell) const {
  if (num_vertices() == 0) return false;

  // We only need to check whether the cell contains vertex 0 for correctness,
  // but these tests are cheap compared to edge crossings so we might as well
  // check all the vertices.
  for (int i = 0; i < num_vertices(); ++i) {
    if (cell.Contains(vertex(i))) return true;
  }
  S2Point cell_vertices[4];
  for (int i = 0; i < 4; ++i) {
    cell_vertices[i] = cell.GetVertex(i);
  }
  for (int j = 0; j < 4; ++j) {
    S2EdgeCrosser crosser(&cell_vertices[j], &cell_vertices[(j+1)&3],
                                    &vertex(0));
    for (int i = 1; i < num_vertices(); ++i) {
      if (crosser.CrossingSign(&vertex(i)) >= 0) {
        // There is a proper crossing, or two vertices were the same.
        return true;
      }
    }
  }
  return false;
}